

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O3

bool anon_unknown.dwarf_8a34d::getFileContents
               (string *filename,vector<char,_std::allocator<char>_> *buffer)

{
  uint uVar1;
  size_type __new_size;
  ifstream file;
  char local_221;
  long local_220 [4];
  uint auStack_200 [122];
  
  std::ifstream::ifstream(local_220,(char *)filename,_S_bin);
  uVar1 = *(uint *)((long)auStack_200 + *(long *)(local_220[0] + -0x18));
  if ((uVar1 & 5) == 0) {
    std::istream::seekg((long)local_220,_S_beg);
    __new_size = std::istream::tellg();
    if (0 < (long)__new_size) {
      std::istream::seekg((long)local_220,_S_beg);
      std::vector<char,_std::allocator<char>_>::resize(buffer,__new_size);
      std::istream::read((char *)local_220,
                         (long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                               super__Vector_impl_data._M_start);
    }
    local_221 = '\0';
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(buffer,&local_221);
  }
  std::ifstream::~ifstream(local_220);
  return (uVar1 & 5) == 0;
}

Assistant:

bool getFileContents(const std::string& filename, std::vector<char>& buffer)
    {
        std::ifstream file(filename.c_str(), std::ios_base::binary);
        if (file)
        {
            file.seekg(0, std::ios_base::end);
            std::streamsize size = file.tellg();
            if (size > 0)
            {
                file.seekg(0, std::ios_base::beg);
                buffer.resize(static_cast<std::size_t>(size));
                file.read(&buffer[0], size);
            }
            buffer.push_back('\0');
            return true;
        }
        else
        {
            return false;
        }
    }